

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

string * __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL>::
recursively_initialise
          (string *__return_storage_ptr__,
          ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL> *this,
          string *var_type,size_t dimension_index,string *init_string)

{
  string *psVar1;
  string local_1a0;
  string local_180;
  string local_160;
  int local_140;
  allocator<char> local_139;
  int sub_script_index;
  string local_118 [32];
  string local_f8 [32];
  string *local_d8;
  size_t indent_index;
  string local_c8 [8];
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_31;
  string *local_30;
  string *init_string_local;
  size_t dimension_index_local;
  string *var_type_local;
  ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL> *this_local;
  string *temp_string;
  
  local_31 = 0;
  local_30 = init_string;
  init_string_local = (string *)dimension_index;
  dimension_index_local = (size_t)var_type;
  var_type_local = (string *)this;
  this_local = (ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL> *
               )__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (init_string_local == (string *)0x0) {
    std::operator+(&local_98,var_type,"(");
    std::operator+(&local_78,&local_98,init_string);
    std::operator+(&local_58,&local_78,")");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c8,"\n",(allocator<char> *)((long)&indent_index + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&indent_index + 7));
    for (local_d8 = init_string_local; local_d8 < (string *)&DAT_00000009;
        local_d8 = (string *)&local_d8->field_0x1) {
      std::__cxx11::string::operator+=(local_c8,"    ");
    }
    std::__cxx11::string::string(local_118,(string *)var_type);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&sub_script_index,"[]",&local_139);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_f8,this,local_118,&sub_script_index,init_string_local);
    std::__cxx11::string::operator+=(local_c8,local_f8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string((string *)&sub_script_index);
    std::allocator<char>::~allocator(&local_139);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::operator+=(local_c8,"(");
    for (local_140 = 0; local_140 < 2; local_140 = local_140 + 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_c8);
      std::__cxx11::string::string((string *)&local_180,(string *)var_type);
      psVar1 = init_string_local + -1;
      std::__cxx11::string::string((string *)&local_1a0,(string *)init_string);
      recursively_initialise
                (&local_160,this,&local_180,(size_t)((long)&psVar1->field_2 + 0xf),&local_1a0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::operator=(local_c8,", ");
      if (init_string_local == (string *)&DAT_00000001) break;
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
    std::__cxx11::string::~string(local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConstructorsAndUnsizedDeclStructConstructors<API>::recursively_initialise(std::string var_type,
																					  size_t	  dimension_index,
																					  std::string init_string)
{
	std::string temp_string;

	if (dimension_index == 0)
	{
		temp_string = var_type + "(" + init_string + ")";
	}
	else
	{
		std::string prefix = "\n";

		for (size_t indent_index = dimension_index; indent_index < (API::MAX_ARRAY_DIMENSIONS + 1); indent_index++)
		{
			prefix += "    ";
		}

		prefix += this->extend_string(var_type, "[]", dimension_index);
		prefix += "(";

		for (int sub_script_index = 0; sub_script_index < 2; sub_script_index++)
		{
			temp_string += prefix;
			temp_string += recursively_initialise(var_type, dimension_index - 1, init_string);
			prefix = ", ";

			if (dimension_index == 1)
			{
				break;
			}
		}
		temp_string += ")";
	}

	return temp_string;
}